

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void set_ips(ns_connection *nc,int is_rem)

{
  void *pvVar1;
  long lVar2;
  bool bVar3;
  char buf [100];
  
  pvVar1 = nc->user_data;
  bVar3 = is_rem == 0;
  lVar2 = (long)pvVar1 + 0x28;
  if (bVar3) {
    lVar2 = (long)pvVar1 + 0x58;
  }
  ns_sock_to_str(nc->sock,buf,100,(uint)!bVar3 * 4 + 3);
  __isoc99_sscanf(buf,"%47[^:]:%hu",lVar2,(long)pvVar1 + (ulong)bVar3 * 2 + 0x88);
  return;
}

Assistant:

static void set_ips(struct ns_connection *nc, int is_rem) {
  struct connection *conn = (struct connection *) nc->user_data;
  struct mg_connection *c = &conn->mg_conn;
  char buf[100];

  ns_sock_to_str(nc->sock, buf, sizeof(buf), is_rem ? 7 : 3);
  sscanf(buf, "%47[^:]:%hu",
         is_rem ? c->remote_ip : c->local_ip,
         is_rem ? &c->remote_port : &c->local_port);
  //DBG(("%p %s %s", conn, is_rem ? "rem" : "loc", buf));
}